

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O2

bool pd::writeMetricsFile
               (string *filename,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
               *distances,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *data)

{
  ostream *poVar1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  double dVar5;
  ostream local_248 [8];
  ofstream of;
  
  std::ofstream::ofstream(local_248,(string *)filename,_S_out);
  p_Var2 = &(data->_M_h)._M_before_begin;
  p_Var3 = p_Var2;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    p_Var4 = p_Var2;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      dVar5 = diffTwoPhrases((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(p_Var3 + 5),
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(p_Var4 + 5),distances);
      if ((1.5 < dVar5) && (dVar5 < 10.0)) {
        poVar1 = std::operator<<(local_248,(string *)(p_Var3 + 1));
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = std::operator<<(poVar1,(string *)(p_Var4 + 1));
        std::operator<<(poVar1," ");
        poVar1 = std::ostream::_M_insert<double>(dVar5);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
  }
  std::ofstream::~ofstream(local_248);
  return true;
}

Assistant:

bool writeMetricsFile(const std::string& filename, std::unordered_map<std::string, std::unordered_map<std::string, double>>& distances, const std::unordered_map<std::string, std::vector<std::string>>& data)
    {
        std::ofstream of(filename);
        for (const auto& s1: data)
        {
            for (const auto& s2: data)
            {
                double dist = metricPhrases(s1.second, s2.second, distances);
                if (dist > 1.5 && dist < 10)
                    of << s1.first << " " << s2.first << " " << dist << std::endl;
            }
        }
        return true;
    }